

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void terminal_deletechars(EditLine *el,wchar_t num)

{
  char **ppcVar1;
  char *pcVar2;
  
  if (((num < L'\x01') || (((el->el_terminal).t_flags & L'\x02') == L'\0')) ||
     ((el->el_terminal).t_size.h < num)) {
    return;
  }
  ppcVar1 = (el->el_terminal).t_str;
  pcVar2 = ppcVar1[0x1e];
  if (((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) ||
     ((num == L'\x01' && ((ppcVar1[6] != (char *)0x0 && (*ppcVar1[6] != '\0')))))) {
    pcVar2 = ppcVar1[8];
    if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
      terminal_outfile = el->el_outfile;
      tputs(pcVar2,1,terminal_putc);
      ppcVar1 = (el->el_terminal).t_str;
    }
    if ((ppcVar1[6] != (char *)0x0) && (*ppcVar1[6] != '\0')) {
      do {
        terminal_outfile = el->el_outfile;
        tputs((el->el_terminal).t_str[6],1,terminal_putc);
        num = num + L'\xffffffff';
      } while (num != L'\0');
      ppcVar1 = (el->el_terminal).t_str;
    }
    pcVar2 = ppcVar1[9];
    if (pcVar2 == (char *)0x0) {
      return;
    }
    if (*pcVar2 == '\0') {
      return;
    }
    terminal_outfile = el->el_outfile;
    num = L'\x01';
  }
  else {
    pcVar2 = (char *)tgoto(pcVar2,num,num);
    terminal_outfile = el->el_outfile;
  }
  tputs(pcVar2,num,terminal_putc);
  return;
}

Assistant:

libedit_private void
terminal_deletechars(EditLine *el, int num)
{
	if (num <= 0)
		return;

	if (!EL_CAN_DELETE) {
#ifdef DEBUG_EDIT
		(void) fprintf(el->el_errfile, "   ERROR: cannot delete   \n");
#endif /* DEBUG_EDIT */
		return;
	}
	if (num > el->el_terminal.t_size.h) {
#ifdef DEBUG_SCREEN
		(void) fprintf(el->el_errfile,
		    "%s: num is ridiculous: %d\r\n", __func__, num);
#endif /* DEBUG_SCREEN */
		return;
	}
	if (GoodStr(T_DC))	/* if I have multiple delete */
		if ((num > 1) || !GoodStr(T_dc)) {	/* if dc would be more
							 * expen. */
			terminal_tputs(el, tgoto(Str(T_DC), num, num), num);
			return;
		}
	if (GoodStr(T_dm))	/* if I have delete mode */
		terminal_tputs(el, Str(T_dm), 1);

	if (GoodStr(T_dc))	/* else do one at a time */
		while (num--)
			terminal_tputs(el, Str(T_dc), 1);

	if (GoodStr(T_ed))	/* if I have delete mode */
		terminal_tputs(el, Str(T_ed), 1);
}